

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenTupleExtractSetTuple(BinaryenExpressionRef expr,BinaryenExpressionRef tupleExpr)

{
  if (expr->_id != TupleExtractId) {
    __assert_fail("expression->is<TupleExtract>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xf57,
                  "void BinaryenTupleExtractSetTuple(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (tupleExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = tupleExpr;
    return;
  }
  __assert_fail("tupleExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xf58,
                "void BinaryenTupleExtractSetTuple(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenTupleExtractSetTuple(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef tupleExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TupleExtract>());
  assert(tupleExpr);
  static_cast<TupleExtract*>(expression)->tuple = (Expression*)tupleExpr;
}